

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

void __thiscall
setup::info::load_entries<setup::type_entry>
          (info *this,istream *is,entry_types entries,size_t count,
          vector<setup::type_entry,_std::allocator<setup::type_entry>_> *result,enum_type entry_type
          )

{
  _Base_bitset<1UL> _Var1;
  long lVar2;
  bool bVar3;
  type_entry entry;
  flags<setup::info::entry_types_Enum_,_21UL> local_108;
  type_entry local_100;
  
  local_108._flags.super__Base_bitset<1UL>._M_w = entries._flags.super__Base_bitset<1UL>._M_w;
  std::vector<setup::type_entry,_std::allocator<setup::type_entry>_>::clear(result);
  _Var1._M_w = (_WordT)flags<setup::info::entry_types_Enum_,_21UL>::operator&(&local_108,entry_type)
  ;
  if ((_Base_bitset<1UL>)_Var1._M_w == (_Base_bitset<1UL>)0x0) {
    while (bVar3 = count != 0, count = count - 1, bVar3) {
      local_100.name._M_dataplus._M_p = (pointer)&local_100.name.field_2;
      local_100.name._M_string_length = 0;
      local_100.name.field_2._M_local_buf[0] = '\0';
      local_100.description._M_dataplus._M_p = (pointer)&local_100.description.field_2;
      local_100.description._M_string_length = 0;
      local_100.description.field_2._M_local_buf[0] = '\0';
      local_100.languages._M_dataplus._M_p = (pointer)&local_100.languages.field_2;
      local_100.languages._M_string_length = 0;
      local_100.languages.field_2._M_local_buf[0] = '\0';
      local_100.check._M_string_length = 0;
      local_100.check.field_2._M_local_buf[0] = '\0';
      local_100.check._M_dataplus._M_p = (pointer)&local_100.check.field_2;
      type_entry::load(&local_100,is,this);
      type_entry::~type_entry(&local_100);
    }
  }
  else {
    std::vector<setup::type_entry,_std::allocator<setup::type_entry>_>::resize(result,count);
    lVar2 = 0;
    while (bVar3 = count != 0, count = count - 1, bVar3) {
      type_entry::load((type_entry *)
                       ((long)&(((result->
                                 super__Vector_base<setup::type_entry,_std::allocator<setup::type_entry>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p
                       + lVar2),is,this);
      lVar2 = lVar2 + 0xd0;
    }
  }
  return;
}

Assistant:

void info::load_entries(std::istream & is, entry_types entries, size_t count,
                        std::vector<Entry> & result, entry_types::enum_type entry_type) {
	
	result.clear();
	if(entries & entry_type) {
		result.resize(count);
		for(size_t i = 0; i < count; i++) {
			result[i].load(is, *this);
		}
	} else {
		for(size_t i = 0; i < count; i++) {
			Entry entry;
			entry.load(is, *this);
		}
	}
}